

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

ethash_return_value_t *
ethash_light_compute(ethash_light_t light,ethash_h256_t header_hash,uint64_t nonce)

{
  ethash_h256_t header_hash_00;
  undefined8 in_RDX;
  long in_RSI;
  ethash_return_value_t *in_RDI;
  undefined1 in_stack_00000000 [16];
  uint64_t full_size;
  undefined1 *full_size_00;
  ethash_return_value_t *light_00;
  
  full_size_00 = &stack0x00000008;
  light_00 = in_RDI;
  ethash_get_datasize(*(uint64_t *)(in_RSI + 0x10));
  header_hash_00.b[8] = (char)in_RSI;
  header_hash_00.b[9] = (char)((ulong)in_RSI >> 8);
  header_hash_00.b[10] = (char)((ulong)in_RSI >> 0x10);
  header_hash_00.b[0xb] = (char)((ulong)in_RSI >> 0x18);
  header_hash_00.b[0xc] = (char)((ulong)in_RSI >> 0x20);
  header_hash_00.b[0xd] = (char)((ulong)in_RSI >> 0x28);
  header_hash_00.b[0xe] = (char)((ulong)in_RSI >> 0x30);
  header_hash_00.b[0xf] = (char)((ulong)in_RSI >> 0x38);
  header_hash_00.b[0] = (char)in_RDX;
  header_hash_00.b[1] = (char)((ulong)in_RDX >> 8);
  header_hash_00.b[2] = (char)((ulong)in_RDX >> 0x10);
  header_hash_00.b[3] = (char)((ulong)in_RDX >> 0x18);
  header_hash_00.b[4] = (char)((ulong)in_RDX >> 0x20);
  header_hash_00.b[5] = (char)((ulong)in_RDX >> 0x28);
  header_hash_00.b[6] = (char)((ulong)in_RDX >> 0x30);
  header_hash_00.b[7] = (char)((ulong)in_RDX >> 0x38);
  header_hash_00.b._16_16_ = in_stack_00000000;
  ethash_light_compute_internal
            ((ethash_light_t)light_00,(uint64_t)full_size_00,header_hash_00,(uint64_t)in_RDI);
  return light_00;
}

Assistant:

ethash_return_value_t ethash_light_compute(
	ethash_light_t light,
	ethash_h256_t const header_hash,
	uint64_t nonce
)
{
	uint64_t full_size = ethash_get_datasize(light->block_number);
	return ethash_light_compute_internal(light, full_size, header_hash, nonce);
}